

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLDateTime::serialize(XMLDateTime *this,XSerializeEngine *serEng)

{
  bool bVar1;
  XMLSize_t local_28;
  XMLSize_t dataLen;
  XSerializeEngine *pXStack_18;
  int i;
  XSerializeEngine *serEng_local;
  XMLDateTime *this_local;
  
  pXStack_18 = serEng;
  serEng_local = (XSerializeEngine *)this;
  XMLNumber::serialize(&this->super_XMLNumber,serEng);
  dataLen._4_4_ = 0;
  bVar1 = XSerializeEngine::isStoring(pXStack_18);
  if (bVar1) {
    for (dataLen._4_4_ = 0; dataLen._4_4_ < 8; dataLen._4_4_ = dataLen._4_4_ + 1) {
      XSerializeEngine::operator<<(pXStack_18,this->fValue[dataLen._4_4_]);
    }
    for (dataLen._4_4_ = 0; dataLen._4_4_ < 2; dataLen._4_4_ = dataLen._4_4_ + 1) {
      XSerializeEngine::operator<<(pXStack_18,this->fTimeZone[dataLen._4_4_]);
    }
    XSerializeEngine::operator<<(pXStack_18,this->fStart);
    XSerializeEngine::operator<<(pXStack_18,this->fEnd);
    XSerializeEngine::writeString(pXStack_18,this->fBuffer,this->fBufferMaxLen,true);
  }
  else {
    for (dataLen._4_4_ = 0; dataLen._4_4_ < 8; dataLen._4_4_ = dataLen._4_4_ + 1) {
      XSerializeEngine::operator>>(pXStack_18,this->fValue + dataLen._4_4_);
    }
    for (dataLen._4_4_ = 0; dataLen._4_4_ < 2; dataLen._4_4_ = dataLen._4_4_ + 1) {
      XSerializeEngine::operator>>(pXStack_18,this->fTimeZone + dataLen._4_4_);
    }
    XSerializeEngine::operator>>(pXStack_18,&this->fStart);
    XSerializeEngine::operator>>(pXStack_18,&this->fEnd);
    local_28 = 0;
    XSerializeEngine::readString(pXStack_18,&this->fBuffer,&this->fBufferMaxLen,&local_28,true);
  }
  return;
}

Assistant:

void XMLDateTime::serialize(XSerializeEngine& serEng)
{
    //REVISIT: may not need to call base since it does nothing
    XMLNumber::serialize(serEng);

    int i = 0;

    if (serEng.isStoring())
    {
        for (i = 0; i < TOTAL_SIZE; i++)
        {
            serEng<<fValue[i];
        }

        for (i = 0; i < TIMEZONE_ARRAYSIZE; i++)
        {
            serEng<<fTimeZone[i];
        }

        serEng<<(unsigned long)fStart;
        serEng<<(unsigned long)fEnd;

        serEng.writeString(fBuffer, fBufferMaxLen, XSerializeEngine::toWriteBufferLen);
    }
    else
    {
        for (i = 0; i < TOTAL_SIZE; i++)
        {
            serEng>>fValue[i];
        }

        for (i = 0; i < TIMEZONE_ARRAYSIZE; i++)
        {
            serEng>>fTimeZone[i];
        }

        serEng>>(unsigned long&)fStart;
        serEng>>(unsigned long&)fEnd;

        XMLSize_t dataLen = 0;
        serEng.readString(fBuffer, fBufferMaxLen, dataLen ,XSerializeEngine::toReadBufferLen);

    }

}